

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O2

Client * __thiscall
capnproto_test::capnp::test::TestMoreStuff::HoldParams::Reader::getCap
          (Client *__return_storage_ptr__,Reader *this)

{
  PointerReader reader;
  int iVar1;
  undefined8 unaff_RBX;
  CapTableReader *pCVar2;
  WirePointer *pWVar3;
  undefined4 in_stack_fffffffffffffff4;
  
  if ((this->_reader).pointerCount == 0) {
    pCVar2 = (CapTableReader *)0x0;
    pWVar3 = (WirePointer *)0x0;
    iVar1 = 0x7fffffff;
  }
  else {
    pWVar3 = (this->_reader).pointers;
    iVar1 = (this->_reader).nestingLimit;
    pCVar2 = (this->_reader).capTable;
  }
  reader.capTable = (CapTableReader *)pWVar3;
  reader.segment = (SegmentReader *)pCVar2;
  reader.pointer._0_4_ = iVar1;
  reader.pointer._4_4_ = in_stack_fffffffffffffff4;
  reader._24_8_ = unaff_RBX;
  ::capnp::_::PointerHelpers<capnproto_test::capnp::test::TestInterface,_(capnp::Kind)5>::get
            (reader);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnproto_test::capnp::test::TestInterface::Client TestMoreStuff::HoldParams::Reader::getCap() const {
  return ::capnp::_::PointerHelpers< ::capnproto_test::capnp::test::TestInterface>::get(_reader.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS));
}